

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdl2.cpp
# Opt level: O2

void E64::sdl2_init(void)

{
  uint uVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  char *pcVar6;
  
  SDL_Init(0x10);
  E64_sdl2_keyboard_state = (uint8_t *)SDL_GetKeyboardState(0);
  uVar1 = SDL_GetNumAudioDrivers();
  printf("[SDL] %d audio backend(s) compiled into SDL: ",(ulong)uVar1);
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
    SDL_GetAudioDriver(uVar5);
    printf(" \'%s\' ");
  }
  putchar(10);
  SDL_memset(&want,0,0x20);
  want.freq = 0xac44;
  want.format = 0x8010;
  want.channels = '\x02';
  want.samples = 0x200;
  want.callback = (SDL_AudioCallback)0x0;
  E64_sdl2_audio_dev = SDL_OpenAudioDevice(0,0,&want,&have,0xf);
  if (E64_sdl2_audio_dev == 0) {
    uVar2 = SDL_GetError();
    printf("[SDL] failed to open audio device: %s\n",uVar2);
    SDL_Quit();
  }
  uVar2 = SDL_GetCurrentAudioDriver();
  printf("[SDL] now using backend \'%s\'\n",uVar2);
  puts("[SDL] audio information");
  puts("\t\t\twant\thave");
  printf("frequency\t%d\t%d\n",(ulong)(uint)want.freq,(ulong)(uint)have.freq);
  pcVar4 = "yes";
  pcVar6 = "yes";
  if (((uint)want._4_4_ >> 8 & 1) == 0) {
    pcVar6 = "no";
  }
  pcVar3 = "yes";
  if (((uint)have._4_4_ >> 8 & 1) == 0) {
    pcVar3 = "no";
  }
  printf("format\n float\t\t%s\t\t%s\n",pcVar6,pcVar3);
  pcVar6 = "yes";
  if (-1 < (short)want.format) {
    pcVar6 = "no";
  }
  pcVar3 = "yes";
  if (-1 < (short)have.format) {
    pcVar3 = "no";
  }
  printf(" signed\t\t%s\t\t%s\n",pcVar6,pcVar3);
  pcVar6 = "yes";
  if (((uint)want._4_4_ >> 0xc & 1) == 0) {
    pcVar6 = "no";
  }
  if (((uint)have._4_4_ >> 0xc & 1) == 0) {
    pcVar4 = "no";
  }
  printf(" big endian\t%s\t\t%s\n",pcVar6,pcVar4);
  printf(" bitsize\t%d\t\t%d\n",(ulong)(want._4_4_ & 0xff),(ulong)(have._4_4_ & 0xff));
  printf("channels\t%d\t\t%d\n",(ulong)((uint)want._4_4_ >> 0x10 & 0xff),
         (ulong)((uint)have._4_4_ >> 0x10 & 0xff));
  printf("samples\t\t%d\t\t%d\n",(ulong)want.samples,(ulong)have.samples);
  audio_running = false;
  return;
}

Assistant:

void E64::sdl2_init()
{
    SDL_Init(SDL_INIT_AUDIO);
    
    // each call to SDL_PollEvent invokes SDL_PumpEvents() that updates this array
    E64_sdl2_keyboard_state = SDL_GetKeyboardState(NULL);

    // INIT AUDIO STUFF
    // print the list of audio backends
    int numAudioDrivers = SDL_GetNumAudioDrivers();
    printf("[SDL] %d audio backend(s) compiled into SDL: ", numAudioDrivers);
    for(int i=0; i<numAudioDrivers; i++)
    {
        printf(" \'%s\' ", SDL_GetAudioDriver(i));
    }
    printf("\n");
    // What's this all about???
    SDL_zero(want);
    // audio specification
    want.freq = SAMPLE_RATE;
    // signed 16bit, little endian
    want.format = AUDIO_S16LSB;
    // 1, 2, 4, or 6  -  1 is mono, 2 is stereo...
    want.channels = 2;
    // power of 2, or 0 then env SDL_AUDIO_SAMPLES is used
    want.samples = 512;
    // can't be NULL
    want.callback = NULL;
    /* open audio device, allowing any changes to the specification */
    E64_sdl2_audio_dev = SDL_OpenAudioDevice(NULL, 0, &want, &have, SDL_AUDIO_ALLOW_ANY_CHANGE);
    if(!E64_sdl2_audio_dev)
    {
        printf("[SDL] failed to open audio device: %s\n", SDL_GetError());
        // this is not enough and even wrong...
        // consider a system without audio support and a frame delay based on FPS?
        SDL_Quit();
    }
    printf("[SDL] now using backend '%s'\n", SDL_GetCurrentAudioDriver());
    printf("[SDL] audio information\n");
    printf("\t\t\twant\thave\n");
    printf("frequency\t%d\t%d\n",want.freq,have.freq);
    printf("format\n float\t\t%s\t\t%s\n",SDL_AUDIO_ISFLOAT(want.format) ? "yes" : "no" ,SDL_AUDIO_ISFLOAT(have.format) ? "yes" : "no");
    printf(" signed\t\t%s\t\t%s\n", SDL_AUDIO_ISSIGNED(want.format) ? "yes" : "no", SDL_AUDIO_ISSIGNED(have.format) ? "yes" : "no");
    printf(" big endian\t%s\t\t%s\n", SDL_AUDIO_ISBIGENDIAN(want.format) ? "yes" : "no", SDL_AUDIO_ISBIGENDIAN(have.format) ? "yes" : "no");
    printf(" bitsize\t%d\t\t%d\n", SDL_AUDIO_BITSIZE(want.format), SDL_AUDIO_BITSIZE(have.format));
    printf("channels\t%d\t\t%d\n", want.channels, have.channels);
    printf("samples\t\t%d\t\t%d\n", want.samples, have.samples);
    audio_running = false;
}